

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

string * __thiscall
flatbuffers::Parser::UnqualifiedName
          (string *__return_storage_ptr__,Parser *this,string *full_qualified_name)

{
  Namespace *pNVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pNVar1 = (Namespace *)operator_new(0x20);
  (pNVar1->components).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar1->components).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pNVar1->components).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar1->from_table = 0;
  lVar2 = std::__cxx11::string::find((char)full_qualified_name,0x2e);
  while (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)full_qualified_name);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pNVar1,&local_50
              );
    std::__cxx11::string::~string((string *)&local_50);
    lVar2 = std::__cxx11::string::find((char)full_qualified_name,0x2e);
  }
  pNVar1 = UniqueNamespace(this,pNVar1);
  this->current_namespace_ = pNVar1;
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)full_qualified_name);
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::UnqualifiedName(const std::string &full_qualified_name) {
  Namespace *ns = new Namespace();

  std::size_t current, previous = 0;
  current = full_qualified_name.find('.');
  while (current != std::string::npos) {
    ns->components.push_back(
        full_qualified_name.substr(previous, current - previous));
    previous = current + 1;
    current = full_qualified_name.find('.', previous);
  }
  current_namespace_ = UniqueNamespace(ns);
  return full_qualified_name.substr(previous, current - previous);
}